

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O1

void __thiscall OpenMD::DataStorage::reserve(DataStorage *this,size_t size)

{
  if ((this->storageLayout_ & 1) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->position,size);
  }
  if ((this->storageLayout_ & 2) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->velocity,size);
  }
  if ((this->storageLayout_ & 4) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->force,size);
  }
  if ((this->storageLayout_ & 8) != 0) {
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    reserve(&this->aMat,size);
  }
  if ((this->storageLayout_ & 0x10) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->angularMomentum,size);
  }
  if ((this->storageLayout_ & 0x20) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->torque,size);
  }
  if ((this->storageLayout_ & 0x40) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->particlePot,size);
  }
  if ((this->storageLayout_ & 0x80) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->density,size);
  }
  if ((this->storageLayout_ & 0x100) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->functional,size);
  }
  if ((this->storageLayout_ & 0x200) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->functionalDerivative,size);
  }
  if ((this->storageLayout_ & 0x400) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->dipole,size);
  }
  if ((this->storageLayout_ & 0x800) != 0) {
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    reserve(&this->quadrupole,size);
  }
  if ((this->storageLayout_ & 0x1000) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
              (&this->electricField,size);
  }
  if ((this->storageLayout_ & 0x2000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->skippedCharge,size);
  }
  if ((this->storageLayout_ & 0x4000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->flucQPos,size);
  }
  if ((this->storageLayout_ & 0x8000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->flucQVel,size);
  }
  if ((this->storageLayout_ & 0x10000) != 0) {
    std::vector<double,_std::allocator<double>_>::reserve(&this->flucQFrc,size);
  }
  if ((this->storageLayout_ & 0x20000) == 0) {
    return;
  }
  std::vector<double,_std::allocator<double>_>::reserve(&this->sitePotential,size);
  return;
}

Assistant:

void DataStorage::reserve(std::size_t size) {
    if (storageLayout_ & dslPosition) { position.reserve(size); }

    if (storageLayout_ & dslVelocity) { velocity.reserve(size); }

    if (storageLayout_ & dslForce) { force.reserve(size); }

    if (storageLayout_ & dslAmat) { aMat.reserve(size); }

    if (storageLayout_ & dslAngularMomentum) { angularMomentum.reserve(size); }

    if (storageLayout_ & dslTorque) { torque.reserve(size); }

    if (storageLayout_ & dslParticlePot) { particlePot.reserve(size); }

    if (storageLayout_ & dslDensity) { density.reserve(size); }

    if (storageLayout_ & dslFunctional) { functional.reserve(size); }

    if (storageLayout_ & dslFunctionalDerivative) {
      functionalDerivative.reserve(size);
    }

    if (storageLayout_ & dslDipole) { dipole.reserve(size); }

    if (storageLayout_ & dslQuadrupole) { quadrupole.reserve(size); }

    if (storageLayout_ & dslElectricField) { electricField.reserve(size); }

    if (storageLayout_ & dslSkippedCharge) { skippedCharge.reserve(size); }

    if (storageLayout_ & dslFlucQPosition) { flucQPos.reserve(size); }

    if (storageLayout_ & dslFlucQVelocity) { flucQVel.reserve(size); }

    if (storageLayout_ & dslFlucQForce) { flucQFrc.reserve(size); }

    if (storageLayout_ & dslSitePotential) { sitePotential.reserve(size); }
  }